

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanBack
          (UnicodeSetStringSpan *this,UChar *s,int32_t length,USetSpanCondition spanCondition)

{
  byte bVar1;
  undefined4 uVar2;
  int iVar3;
  UBool UVar4;
  int32_t iVar5;
  int32_t iVar6;
  uint length_00;
  UnicodeString *pUVar7;
  char16_t *pcVar8;
  int local_c8;
  int32_t oldPos;
  int32_t dec_1;
  int32_t length16_1;
  UChar *s16_1;
  UnicodeString *string_1;
  uint local_a8;
  int32_t overlap_1;
  int32_t maxOverlap;
  int32_t maxDec;
  int local_98;
  int32_t dec;
  int32_t len1;
  int32_t length16;
  UChar *s16;
  UnicodeString *string;
  uint8_t *puStack_78;
  int32_t overlap;
  uint8_t *spanBackLengths;
  int local_68;
  int32_t stringsLength;
  int32_t i;
  undefined1 local_58 [8];
  OffsetList offsets;
  int32_t spanLength;
  int32_t pos;
  USetSpanCondition spanCondition_local;
  int32_t length_local;
  UChar *s_local;
  UnicodeSetStringSpan *this_local;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    this_local._4_4_ = spanNotBack(this,s,length);
  }
  else {
    offsets._36_4_ = UnicodeSet::spanBack(&this->spanSet,s,length,USET_SPAN_CONTAINED);
    if (offsets._36_4_ != 0) {
      offsets.staticList._12_4_ = length - offsets._36_4_;
      OffsetList::OffsetList((OffsetList *)local_58);
      if (spanCondition == USET_SPAN_CONTAINED) {
        OffsetList::setMaxLength((OffsetList *)local_58,this->maxLength16);
      }
      iVar5 = UVector::size(this->strings);
      puStack_78 = this->spanLengths;
      if (this->all != '\0') {
        puStack_78 = puStack_78 + iVar5;
      }
LAB_0038c37e:
      if (spanCondition == USET_SPAN_CONTAINED) {
        for (local_68 = 0; local_68 < iVar5; local_68 = local_68 + 1) {
          string._4_4_ = (uint)puStack_78[local_68];
          if (string._4_4_ != 0xff) {
            pUVar7 = (UnicodeString *)UVector::elementAt(this->strings,local_68);
            pcVar8 = UnicodeString::getBuffer(pUVar7);
            iVar6 = UnicodeString::length(pUVar7);
            if (0xfd < string._4_4_) {
              local_98 = 1;
              iVar3 = 1;
              if ((((*pcVar8 & 0xfc00U) == 0xd800) && (iVar3 = local_98, iVar6 != 1)) &&
                 ((pcVar8[1] & 0xfc00U) == 0xdc00)) {
                iVar3 = 2;
              }
              local_98 = iVar3;
              string._4_4_ = iVar6 - local_98;
            }
            if ((int)offsets.staticList._12_4_ < (int)string._4_4_) {
              string._4_1_ = offsets.staticList[0xc];
              string._5_1_ = offsets.staticList[0xd];
              string._6_1_ = offsets.staticList[0xe];
              string._7_1_ = offsets.staticList[0xf];
            }
            for (maxDec = iVar6 - string._4_4_; maxDec <= (int)offsets._36_4_; maxDec = maxDec + 1)
            {
              UVar4 = OffsetList::containsOffset((OffsetList *)local_58,maxDec);
              if ((UVar4 == '\0') &&
                 (UVar4 = matches16CPB(s,offsets._36_4_ - maxDec,length,pcVar8,iVar6), UVar4 != '\0'
                 )) {
                if (maxDec == offsets._36_4_) {
                  this_local._4_4_ = 0;
                  goto LAB_0038c8f2;
                }
                OffsetList::addOffset((OffsetList *)local_58,maxDec);
              }
              if (string._4_4_ == 0) break;
              string._4_4_ = string._4_4_ - 1;
            }
          }
        }
      }
      else {
        overlap_1 = 0;
        local_a8 = 0;
        for (local_68 = 0; local_68 < iVar5; local_68 = local_68 + 1) {
          bVar1 = puStack_78[local_68];
          pUVar7 = (UnicodeString *)UVector::elementAt(this->strings,local_68);
          pcVar8 = UnicodeString::getBuffer(pUVar7);
          length_00 = UnicodeString::length(pUVar7);
          string_1._4_4_ = (uint)bVar1;
          if (0xfd < bVar1) {
            string_1._4_4_ = length_00;
          }
          if ((int)offsets.staticList._12_4_ < (int)string_1._4_4_) {
            string_1._4_1_ = offsets.staticList[0xc];
            string_1._5_1_ = offsets.staticList[0xd];
            string_1._6_1_ = offsets.staticList[0xe];
            string_1._7_1_ = offsets.staticList[0xf];
          }
          local_c8 = length_00 - string_1._4_4_;
          while( true ) {
            if (((int)offsets._36_4_ < local_c8) || ((int)string_1._4_4_ < (int)local_a8))
            goto LAB_0038c732;
            if ((((int)local_a8 < (int)string_1._4_4_) || (overlap_1 < local_c8)) &&
               (UVar4 = matches16CPB(s,offsets._36_4_ - local_c8,length,pcVar8,length_00),
               UVar4 != '\0')) break;
            string_1._4_4_ = string_1._4_4_ - 1;
            local_c8 = local_c8 + 1;
          }
          overlap_1 = local_c8;
          local_a8 = string_1._4_4_;
LAB_0038c732:
        }
        if ((overlap_1 != 0) || (local_a8 != 0)) {
          offsets._36_4_ = offsets._36_4_ - overlap_1;
          if (offsets._36_4_ == 0) {
            this_local._4_4_ = 0;
            goto LAB_0038c8f2;
          }
          offsets.staticList[0xc] = '\0';
          offsets.staticList[0xd] = '\0';
          offsets.staticList[0xe] = '\0';
          offsets.staticList[0xf] = '\0';
          goto LAB_0038c37e;
        }
      }
      if ((offsets.staticList._12_4_ == 0) && (offsets._36_4_ != length)) {
        UVar4 = OffsetList::isEmpty((OffsetList *)local_58);
        uVar2 = offsets._36_4_;
        if (UVar4 == '\0') {
          offsets.staticList._12_4_ = spanOneBack(&this->spanSet,s,offsets._36_4_);
          if ((int)offsets.staticList._12_4_ < 1) goto LAB_0038c8c7;
          if (offsets.staticList._12_4_ == offsets._36_4_) {
            this_local._4_4_ = 0;
LAB_0038c8f2:
            OffsetList::~OffsetList((OffsetList *)local_58);
            return this_local._4_4_;
          }
          offsets._36_4_ = offsets._36_4_ - offsets.staticList._12_4_;
          OffsetList::shift((OffsetList *)local_58,offsets.staticList._12_4_);
          offsets.staticList[0xc] = '\0';
          offsets.staticList[0xd] = '\0';
          offsets.staticList[0xe] = '\0';
          offsets.staticList[0xf] = '\0';
        }
        else {
          offsets._36_4_ = UnicodeSet::spanBack(&this->spanSet,s,offsets._36_4_,USET_SPAN_CONTAINED)
          ;
          offsets.staticList._12_4_ = uVar2 - offsets._36_4_;
          this_local._4_4_ = offsets._36_4_;
          if ((offsets._36_4_ == 0) || (offsets.staticList._12_4_ == 0)) goto LAB_0038c8f2;
        }
      }
      else {
        UVar4 = OffsetList::isEmpty((OffsetList *)local_58);
        if (UVar4 != '\0') {
          this_local._4_4_ = offsets._36_4_;
          goto LAB_0038c8f2;
        }
LAB_0038c8c7:
        iVar6 = OffsetList::popMinimum((OffsetList *)local_58);
        offsets._36_4_ = offsets._36_4_ - iVar6;
        offsets.staticList[0xc] = '\0';
        offsets.staticList[0xd] = '\0';
        offsets.staticList[0xe] = '\0';
        offsets.staticList[0xf] = '\0';
      }
      goto LAB_0038c37e;
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t UnicodeSetStringSpan::spanBack(const UChar *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNotBack(s, length);
    }
    int32_t pos=spanSet.spanBack(s, length, USET_SPAN_CONTAINED);
    if(pos==0) {
        return 0;
    }
    int32_t spanLength=length-pos;

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength16);
    }
    int32_t i, stringsLength=strings.size();
    uint8_t *spanBackLengths=spanLengths;
    if(all) {
        spanBackLengths+=stringsLength;
    }
    for(;;) {
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanBackLengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    continue;  // Irrelevant string.
                }
                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-(length16-overlap)..pos-length16.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // While contained: No point matching fully inside the code point span.
                    int32_t len1=0;
                    U16_FWD_1(s16, len1, overlap);
                    overlap-=len1;  // Length of the string minus the first code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length16-overlap;  // Keep dec+overlap==length16.
                for(;;) {
                    if(dec>pos) {
                        break;
                    }
                    // Try to match if the decrement is not listed already.
                    if(!offsets.containsOffset(dec) && matches16CPB(s, pos-dec, length, s16, length16)) {
                        if(dec==pos) {
                            return 0;  // Reached the start of the string.
                        }
                        offsets.addOffset(dec);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++dec;
                }
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxDec=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanBackLengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the latest end.

                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-(length16-overlap)..pos-length16.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the latest end.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length16-overlap;  // Keep dec+overlap==length16.
                for(;;) {
                    if(dec>pos || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or ends later.
                    if( (overlap>maxOverlap || /* redundant overlap==maxOverlap && */ dec>maxDec) &&
                        matches16CPB(s, pos-dec, length, s16, length16)
                    ) {
                        maxDec=dec;  // Longest match from latest end.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++dec;
                }
            }

            if(maxDec!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue before it.
                pos-=maxDec;
                if(pos==0) {
                    return 0;  // Reached the start of the string.
                }
                spanLength=0;  // Match strings from before a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==length) {
            // The position is before an unlimited code point span (spanLength!=0),
            // not before a string match.
            // The only position where spanLength==0 before a span is pos==length.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched before a span.
            }
            // Match strings from before the next string match.
        } else {
            // The position is before a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched before a previous string match.
                // Try another code point span from before the last string match.
                int32_t oldPos=pos;
                pos=spanSet.spanBack(s, oldPos, USET_SPAN_CONTAINED);
                spanLength=oldPos-pos;
                if( pos==0 ||           // Reached the start of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos;
                }
                continue;  // spanLength>0: Match strings from before a span.
            } else {
                // Try to match only one code point from before a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOneBack(spanSet, s, pos);
                if(spanLength>0) {
                    if(spanLength==pos) {
                        return 0;  // Reached the start of the string.
                    }
                    // Match strings before this code point.
                    // There cannot be any decrements below it because UnicodeSet strings
                    // contain multiple code points.
                    pos-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from before a single code point.
                }
                // Match strings from before the next string match.
            }
        }
        pos-=offsets.popMinimum();
        spanLength=0;  // Match strings from before a string match.
    }
}